

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3,int hasres)

{
  StkId pTVar1;
  StkId pTVar2;
  Value *pVVar3;
  StkId pTVar4;
  TValue *io2_4;
  TValue *io1_4;
  TValue *io2_3;
  TValue *io1_3;
  TValue *io2_2;
  TValue *io1_2;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  StkId func;
  ptrdiff_t result;
  int hasres_local;
  TValue *p3_local;
  TValue *p2_local;
  TValue *p1_local;
  TValue *f_local;
  lua_State *L_local;
  
  pTVar1 = L->stack;
  pTVar4 = L->top;
  pTVar4->value_ = f->value_;
  pTVar4->tt_ = f->tt_;
  if ((pTVar4->tt_ & 0x8000) != 0) {
    if ((pTVar4->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x81,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
    if ((pTVar4->tt_ & 0x7f) != (ushort)((pTVar4->value_).gc)->tt) {
LAB_00140d4c:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x81,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar4->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x81,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if ((((pTVar4->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00140d4c;
    }
  }
  pTVar2 = pTVar4 + 1;
  pTVar2->value_ = p1->value_;
  pTVar4[1].tt_ = p1->tt_;
  if ((pTVar4[1].tt_ & 0x8000) != 0) {
    if ((pTVar4[1].tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x82,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
    if ((pTVar4[1].tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_00140e69:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x82,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar4[1].tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x82,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00140e69;
    }
  }
  pTVar2 = pTVar4 + 2;
  pTVar2->value_ = p2->value_;
  pTVar4[2].tt_ = p2->tt_;
  if ((pTVar4[2].tt_ & 0x8000) != 0) {
    if ((pTVar4[2].tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x83,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
    if ((pTVar4[2].tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_00140f86:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x83,
                    "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                   );
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar4[2].tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x83,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00140f86;
    }
  }
  L->top = L->top + 3;
  if (hasres == 0) {
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pTVar2->value_ = p3->value_;
    pTVar2->tt_ = p3->tt_;
    if ((pTVar2->tt_ & 0x8000) != 0) {
      if ((pTVar2->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x86,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if ((pTVar2->tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_001410c8:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x86,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar2->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                        ,0x86,
                        "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                       );
        }
        if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001410c8;
      }
    }
  }
  if ((L->ci->callstatus & 2) == 0) {
    luaD_callnoyield(L,pTVar4,hasres);
  }
  else {
    luaD_call(L,pTVar4,hasres);
  }
  if (hasres != 0) {
    pVVar3 = (Value *)((long)L->stack + ((long)p3 - (long)pTVar1));
    pTVar1 = L->top;
    pTVar4 = pTVar1 + -1;
    L->top = pTVar4;
    *pVVar3 = pTVar4->value_;
    *(LuaType *)(pVVar3 + 1) = pTVar1[-1].tt_;
    if (((ulong)pVVar3[1] & 0x8000) != 0) {
      if (((ulong)pVVar3[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x8e,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if ((*(ushort *)(pVVar3 + 1) & 0x7f) != (ushort)pVVar3->gc->tt) {
LAB_00141263:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x8e,
                      "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                     );
      }
      if (L != (lua_State *)0x0) {
        if (((ulong)pVVar3[1] & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                        ,0x8e,
                        "void luaT_callTM(lua_State *, const TValue *, const TValue *, const TValue *, TValue *, int)"
                       );
        }
        if ((pVVar3->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00141263;
      }
    }
  }
  return;
}

Assistant:

void luaT_callTM (lua_State *L, const TValue *f, const TValue *p1,
                  const TValue *p2, TValue *p3, int hasres) {
  ptrdiff_t result = savestack(L, p3);
  StkId func = L->top;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  L->top += 3;
  if (!hasres)  /* no result? 'p3' is third argument */
    setobj2s(L, L->top++, p3);  /* 3rd argument */
  /* metamethod may yield only when called from Lua code */
  if (isLua(L->ci))
    luaD_call(L, func, hasres);
  else
    luaD_callnoyield(L, func, hasres);
  if (hasres) {  /* if has result, move it to its place */
    p3 = restorestack(L, result);
    setobjs2s(L, p3, --L->top);
  }
}